

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

real __thiscall fasttext::DenseMatrix::l2NormRow(DenseMatrix *this,int64_t i)

{
  float fVar1;
  long lVar2;
  ulong uVar3;
  EncounteredNaNError *this_00;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  lVar2 = (this->super_Matrix).n_;
  dVar7 = 0.0;
  if (0 < lVar2) {
    uVar6 = i * lVar2;
    uVar3 = (this->data_).size_;
    uVar5 = 0;
    if (uVar6 <= uVar3) {
      uVar5 = uVar3 - uVar6;
    }
    if (uVar5 <= lVar2 - 1U) {
      __assert_fail("i * n_ + j < data_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/densematrix.h"
                    ,0x31,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
    }
    lVar4 = 0;
    do {
      fVar1 = (this->data_).mem_[uVar6 + lVar4];
      dVar7 = dVar7 + (double)(fVar1 * fVar1);
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
    if (NAN(dVar7)) {
      this_00 = (EncounteredNaNError *)__cxa_allocate_exception(0x10);
      EncounteredNaNError::EncounteredNaNError(this_00);
      __cxa_throw(this_00,&EncounteredNaNError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  return (float)dVar7;
}

Assistant:

real DenseMatrix::l2NormRow(int64_t i) const {
  auto norm = 0.0;
  for (auto j = 0; j < n_; j++) {
    norm += at(i, j) * at(i, j);
  }
  if (std::isnan(norm)) {
    throw EncounteredNaNError();
  }
  return std::sqrt(norm);
}